

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

Template * __thiscall
inja::Parser::parse_template(Template *__return_storage_ptr__,Parser *this,string_view filename)

{
  size_type sVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  undefined1 local_d0 [32];
  size_type sStack_b0;
  Kind local_98;
  const_pointer local_90;
  size_type sStack_88;
  Kind local_80;
  const_pointer local_78;
  size_type sStack_70;
  bool local_68;
  TemplateStorage *local_60;
  ParserStatic *local_58;
  vector<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_> local_50;
  pointer puStack_38;
  pointer local_30;
  pointer puStack_28;
  
  local_e0.size_ = filename.size_;
  local_e0.data_ = filename.data_;
  (__return_storage_ptr__->bytecodes).
  super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->bytecodes).
  super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->bytecodes).
  super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->content)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->content).field_2;
  (__return_storage_ptr__->content)._M_string_length = 0;
  (__return_storage_ptr__->content).field_2._M_local_buf[0] = '\0';
  load_file_abi_cxx11_((string *)local_d0,this,filename);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->content,(string *)local_d0);
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_);
  }
  bVar2.size_ = 2;
  bVar2.data_ = "/\\";
  sVar1 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                    (&local_e0,bVar2,0xffffffffffffffff);
  bVar2 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                    (&local_e0,0,sVar1 + 1);
  local_d0._0_8_ = this->m_config;
  local_d0._16_8_ = (this->m_lexer).m_config;
  local_60 = this->m_included_templates;
  local_d0._24_8_ = 0;
  sStack_b0 = 0;
  local_98 = Unknown;
  local_90 = (const_pointer)0x0;
  sStack_88 = 0;
  local_80 = Unknown;
  local_78 = (const_pointer)0x0;
  sStack_70 = 0;
  local_68 = false;
  local_58 = ParserStatic::get_instance();
  local_50.super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puStack_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  puStack_28 = (pointer)0x0;
  parse_into((Parser *)local_d0,__return_storage_ptr__,bVar2);
  if (puStack_38 != (pointer)0x0) {
    operator_delete(puStack_38);
  }
  std::vector<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>::~vector(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Template parse_template(nonstd::string_view filename) {
		Template result;
		result.content = load_file(filename);

		nonstd::string_view path = filename.substr(0, filename.find_last_of("/\\") + 1);
		// StringRef path = sys::path::parent_path(filename);
		Parser(m_config, m_lexer.get_config(), m_included_templates).parse_into(result, path);
		return result;
	}